

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Generators<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>
* __thiscall
Catch::Generators::
makeGenerators<binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>>
          (Generators<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>
           *__return_storage_ptr__,Generators *this,
          binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
          *val,binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
               *moreGenerators,
          binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
          *moreGenerators_1,
          binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
          *moreGenerators_2,
          binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
          *moreGenerators_3,
          binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
          *moreGenerators_4,
          binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
          *moreGenerators_5,
          binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
          *moreGenerators_6,
          binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
          *moreGenerators_7,
          binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
          *moreGenerators_8)

{
  long *local_38;
  
  value<binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>>
            ((Generators *)&local_38,
             (binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
              *)this);
  Generators<binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>>
  ::
  Generators<Catch::Generators::GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>>
            ((Generators<binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>>
              *)__return_storage_ptr__,
             (GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>
              *)&local_38,val,moreGenerators,moreGenerators_1,moreGenerators_2,moreGenerators_3,
             moreGenerators_4,moreGenerators_5,moreGenerators_6,moreGenerators_7);
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }